

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Sphere::writeTo(Sphere *this,BinaryWriter *binary)

{
  Shape::writeTo(&this->super_Shape,binary);
  BinaryWriter::write<float>(binary,&this->radius);
  BinaryWriter::write<pbrt::math::affine3f>(binary,&this->transform);
  return 0x34;
}

Assistant:

int Sphere::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(radius);
    binary.write(transform);
    return TYPE_SPHERE;
  }